

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateCompositeConstructForComponentOfLoad
          (InterfaceVariableScalarReplacement *this,Instruction *load,uint32_t depth_to_component)

{
  uint32_t ty_id;
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  DefUseManager *def_use_mgr_00;
  Instruction *this_00;
  pointer inst;
  pointer ppVar4;
  pair<const_unsigned_int,_unsigned_int> local_80;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_78;
  uint32_t local_6c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_68;
  iterator itr;
  Instruction *insert_before;
  Instruction *composite_construct;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_composite_construct;
  uint32_t new_id;
  uint32_t type_id;
  DefUseManager *def_use_mgr;
  Instruction *pIStack_18;
  uint32_t depth_to_component_local;
  Instruction *load_local;
  InterfaceVariableScalarReplacement *this_local;
  
  def_use_mgr._4_4_ = depth_to_component;
  pIStack_18 = load;
  load_local = (Instruction *)this;
  pIVar3 = Pass::context(&this->super_Pass);
  def_use_mgr_00 = IRContext::get_def_use_mgr(pIVar3);
  new_composite_construct._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       opt::Instruction::type_id(pIStack_18);
  if (def_use_mgr._4_4_ != 0) {
    uVar2 = opt::Instruction::type_id(pIStack_18);
    new_composite_construct._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         anon_unknown_0::GetComponentTypeOfArrayMatrix(def_use_mgr_00,uVar2,def_use_mgr._4_4_);
  }
  pIVar3 = Pass::context(&this->super_Pass);
  new_composite_construct._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       IRContext::TakeNextId(pIVar3);
  this_00 = (Instruction *)::operator_new(0x70);
  pIVar3 = Pass::context(&this->super_Pass);
  ty_id = new_composite_construct._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  uVar2 = (uint32_t)
          new_composite_construct._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  memset(&composite_construct,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
             &composite_construct);
  opt::Instruction::Instruction
            (this_00,pIVar3,OpCompositeConstruct,ty_id,uVar2,(OperandList *)&composite_construct);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_38,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
             &composite_construct);
  inst = std::
         unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
         get(&local_38);
  analysis::DefUseManager::AnalyzeInstDefUse(def_use_mgr_00,inst);
  itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
       utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                 (&pIStack_18->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  while( true ) {
    local_6c = opt::Instruction::result_id
                         ((Instruction *)
                          itr.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->composite_ids_to_component_depths,&local_6c);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->composite_ids_to_component_depths);
    bVar1 = std::__detail::operator==(&local_68,&local_78);
    if ((bVar1) ||
       (ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_68), ppVar4->second <= def_use_mgr._4_4_)) break;
    itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
         utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                   ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                    itr.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur);
  }
  opt::Instruction::InsertBefore
            ((Instruction *)
             itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
             _M_cur,&local_38);
  std::pair<const_unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
            (&local_80,(uint *)&new_composite_construct,(uint *)((long)&def_use_mgr + 4));
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::insert(&this->composite_ids_to_component_depths,&local_80);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_38);
  return inst;
}

Assistant:

Instruction*
InterfaceVariableScalarReplacement::CreateCompositeConstructForComponentOfLoad(
    Instruction* load, uint32_t depth_to_component) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t type_id = load->type_id();
  if (depth_to_component != 0) {
    type_id = GetComponentTypeOfArrayMatrix(def_use_mgr, load->type_id(),
                                            depth_to_component);
  }
  uint32_t new_id = context()->TakeNextId();
  std::unique_ptr<Instruction> new_composite_construct(new Instruction(
      context(), spv::Op::OpCompositeConstruct, type_id, new_id, {}));
  Instruction* composite_construct = new_composite_construct.get();
  def_use_mgr->AnalyzeInstDefUse(composite_construct);

  // Insert |new_composite_construct| after |load|. When there are multiple
  // recursive composite construct instructions for a load, we have to place the
  // composite construct with a lower depth later because it constructs the
  // composite that contains other composites with lower depths.
  auto* insert_before = load->NextNode();
  while (true) {
    auto itr =
        composite_ids_to_component_depths.find(insert_before->result_id());
    if (itr == composite_ids_to_component_depths.end()) break;
    if (itr->second <= depth_to_component) break;
    insert_before = insert_before->NextNode();
  }
  insert_before->InsertBefore(std::move(new_composite_construct));
  composite_ids_to_component_depths.insert({new_id, depth_to_component});
  return composite_construct;
}